

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O1

ssize_t __thiscall
uWS::AsyncSocket<false>::write(AsyncSocket<false> *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  uint uVar2;
  LoopData *pLVar3;
  pair<int,_bool> *this_00;
  pair<int,_bool> pVar4;
  pair<int,_bool> pVar5;
  pair<int,_bool> pVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  char *src;
  int in_R8D;
  pair<int,_bool> pVar8;
  bool local_68;
  long *local_50 [2];
  long local_40 [2];
  
  src = (char *)CONCAT44(in_register_00000034,__fd);
  pVar6 = (pair<int,_bool>)((ulong)__buf & 0xffffffff);
  uVar7 = 0;
  iVar1 = us_socket_is_closed(0,this);
  pVar4 = pVar6;
  if (iVar1 != 0) goto LAB_00138d12;
  pLVar3 = getLoopData(this);
  this_00 = (pair<int,_bool> *)us_socket_ext(0,this);
  iVar1 = (int)__buf;
  local_68 = SUB81(__n,0);
  if (this_00[1] != (pair<int,_bool>)0x0) {
    uVar2 = us_socket_write(0,this,*this_00,this_00[1],pVar6);
    pVar8._4_4_ = 0;
    pVar8.first = uVar2;
    pVar5 = this_00[1];
    if ((ulong)pVar8 < (ulong)pVar5) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pVar4.first = 0;
      pVar4.second = false;
      pVar4._5_3_ = 0;
      if (local_68 == false) {
        std::__cxx11::string::append((char *)this_00,(ulong)src);
        pVar4 = pVar6;
      }
    }
    else {
      this_00[1].first = 0;
      this_00[1].second = false;
      *(undefined3 *)&this_00[1].field_0x5 = 0;
      pVar4 = *this_00;
      *(undefined1 *)pVar4 = 0;
    }
    uVar7 = 1;
    if ((ulong)pVar8 < (ulong)pVar5) goto LAB_00138d12;
  }
  if (iVar1 != 0) {
    if ((AsyncSocket<false> *)pLVar3->corkedSocket != this) {
      uVar2 = us_socket_write(0,this,src,pVar6,in_R8D != 0);
      pVar5._4_4_ = 0;
      pVar5.first = uVar2;
      pVar4 = pVar6;
      if ((int)uVar2 < iVar1) {
        pVar4 = pVar5;
      }
      if ((int)uVar2 < iVar1 && local_68 == false) {
        if (in_R8D != 0) {
          std::__cxx11::string::reserve((ulong)this_00);
        }
        std::__cxx11::string::append((char *)this_00,(ulong)(src + (int)uVar2));
        uVar7 = 1;
        pVar4 = pVar6;
      }
      else {
        uVar7 = (ulong)((int)uVar2 < iVar1);
      }
      goto LAB_00138d12;
    }
    if (0x4000 - pLVar3->corkOffset < iVar1) {
      pVar4 = uncork(this,src,iVar1,local_68);
      uVar7 = (ulong)pVar4 >> 0x20;
      goto LAB_00138d12;
    }
    memcpy(pLVar3->corkBuffer + pLVar3->corkOffset,src,(long)iVar1);
    pLVar3->corkOffset = pLVar3->corkOffset + iVar1;
  }
  uVar7 = 0;
  pVar4 = pVar6;
LAB_00138d12:
  return (ulong)pVar4 & 0xffffffff | (uVar7 & 0xff) << 0x20;
}

Assistant:

std::pair<int, bool> write(const char *src, int length, bool optionally = false, int nextLength = 0) {
        /* Fake success if closed, simple fix to allow uncork of closed socket to succeed */
        if (us_socket_is_closed(SSL, (us_socket_t *) this)) {
            return {length, false};
        }

        LoopData *loopData = getLoopData();
        AsyncSocketData<SSL> *asyncSocketData = getAsyncSocketData();

        /* We are limited if we have a per-socket buffer */
        if (asyncSocketData->buffer.length()) {
            /* Write off as much as we can */
            int written = us_socket_write(SSL, (us_socket_t *) this, asyncSocketData->buffer.data(), (int) asyncSocketData->buffer.length(), /*nextLength != 0 | */length);

            /* On failure return, otherwise continue down the function */
            if ((unsigned int) written < asyncSocketData->buffer.length()) {

                /* Update buffering (todo: we can do better here if we keep track of what happens to this guy later on) */
                asyncSocketData->buffer = asyncSocketData->buffer.substr(written);

                if (optionally) {
                    /* Thankfully we can exit early here */
                    return {0, true};
                } else {
                    /* This path is horrible and points towards erroneous usage */
                    asyncSocketData->buffer.append(src, length);

                    return {length, true};
                }
            }

            /* At this point we simply have no buffer and can continue as normal */
            asyncSocketData->buffer.clear();
        }

        if (length) {
            if (loopData->corkedSocket == this) {
                /* We are corked */
                if (LoopData::CORK_BUFFER_SIZE - loopData->corkOffset >= length) {
                    /* If the entire chunk fits in cork buffer */
                    memcpy(loopData->corkBuffer + loopData->corkOffset, src, length);
                    loopData->corkOffset += length;
                    /* Fall through to default return */
                } else {
                    /* Strategy differences between SSL and non-SSL regarding syscall minimizing */
                    if constexpr (SSL) {
                        /* Cork up as much as we can */
                        int stripped = LoopData::CORK_BUFFER_SIZE - loopData->corkOffset;
                        memcpy(loopData->corkBuffer + loopData->corkOffset, src, stripped);
                        loopData->corkOffset = LoopData::CORK_BUFFER_SIZE;

                        auto [written, failed] = uncork(src + stripped, length - stripped, optionally);
                        return {written + stripped, failed};
                    }

                    /* For non-SSL we take the penalty of two syscalls */
                    return uncork(src, length, optionally);
                }
            } else {
                /* We are not corked */
                int written = us_socket_write(SSL, (us_socket_t *) this, src, length, nextLength != 0);

                /* Did we fail? */
                if (written < length) {
                    /* If the write was optional then just bail out */
                    if (optionally) {
                        return {written, true};
                    }

                    /* Fall back to worst possible case (should be very rare for HTTP) */
                    /* At least we can reserve room for next chunk if we know it up front */
                    if (nextLength) {
                        asyncSocketData->buffer.reserve(asyncSocketData->buffer.length() + length - written + nextLength);
                    }

                    /* Buffer this chunk */
                    asyncSocketData->buffer.append(src + written, length - written);

                    /* Return the failure */
                    return {length, true};
                }
                /* Fall through to default return */
            }
        }

        /* Default fall through return */
        return {length, false};
    }